

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::propagateLit(Solver *this,Lit l,vec<Minisat::Lit> *implied)

{
  bool bVar1;
  CRef CVar2;
  int iVar3;
  Lit *in_RDX;
  undefined4 in_ESI;
  Solver *in_RDI;
  int i;
  CRef cr;
  int pre_size;
  Solver *in_stack_00000028;
  Lit in_stack_00000034;
  bool conflict;
  undefined4 in_stack_00000054;
  Solver *in_stack_00000200;
  lbool *in_stack_ffffffffffffffa8;
  Lit *elem;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  Lit in_stack_ffffffffffffffc0;
  int local_3c;
  lbool local_29;
  undefined4 local_28;
  lbool local_22;
  lbool local_21;
  undefined4 local_20;
  uint8_t local_1a;
  byte local_19;
  Lit *local_18;
  undefined4 local_8;
  bool local_1;
  
  local_18 = in_RDX;
  local_8 = in_ESI;
  cancelUntil((Solver *)CONCAT44(in_stack_00000054,l.x),this._4_4_,this._3_1_);
  vec<Minisat::Lit>::clear
            ((vec<Minisat::Lit> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  local_19 = 0;
  local_20 = local_8;
  local_1a = (uint8_t)value(in_RDI,in_stack_ffffffffffffffc0);
  lbool::lbool(&local_21,'\x02');
  bVar1 = lbool::operator!=(in_stack_ffffffffffffffa8,
                            (lbool)(uint8_t)((uint)in_stack_ffffffffffffffb4 >> 0x18));
  if (bVar1) {
    local_28 = local_8;
    local_22 = value(in_RDI,in_stack_ffffffffffffffc0);
    lbool::lbool(&local_29,'\x01');
    local_1 = lbool::operator==(&local_22,local_29);
  }
  else {
    newDecisionLevel((Solver *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    decisionLevel((Solver *)0x1370d3);
    uncheckedEnqueue(in_stack_00000028,in_stack_00000034,pre_size,cr);
    local_3c = vec<Minisat::Lit>::size(&in_RDI->trail);
    CVar2 = propagate(in_stack_00000200);
    if (CVar2 != 0xffffffff) {
      local_19 = 1;
    }
    while (iVar4 = local_3c, iVar3 = vec<Minisat::Lit>::size(&in_RDI->trail), iVar4 < iVar3) {
      elem = local_18;
      vec<Minisat::Lit>::operator[](&in_RDI->trail,local_3c);
      vec<Minisat::Lit>::push((vec<Minisat::Lit> *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),elem);
      local_3c = local_3c + 1;
    }
    cancelUntil((Solver *)CONCAT44(in_stack_00000054,l.x),this._4_4_,this._3_1_);
    local_1 = (bool)(local_19 & 1);
  }
  return local_1;
}

Assistant:

bool Solver::propagateLit(Lit l, vec<Lit> &implied)
{
    cancelUntil(0);
    implied.clear();
    bool conflict = false;

    // literal is a unit clause
    if (value(l) != l_Undef) {
        return value(l) == l_False;
    }
    assert(value(l) == l_Undef);

    // propagate on a new decision level, to be able to roll back
    newDecisionLevel();
    uncheckedEnqueue(l, decisionLevel(), CRef_Undef);

    // collect trail literals
    int pre_size = trail.size();
    CRef cr = propagate();
    if (cr != CRef_Undef) conflict = true;
    for (int i = pre_size; i < trail.size(); i++) {
        implied.push(trail[i]);
    }
    cancelUntil(0);

    return conflict;
}